

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fair_mutex.hpp
# Opt level: O1

void __thiscall yamc::fair::recursive_timed_mutex::lock(recursive_timed_mutex *this)

{
  pthread_t pVar1;
  unique_lock<std::mutex> lk;
  unique_lock<std::mutex> local_28;
  
  pVar1 = pthread_self();
  local_28._M_device = &(this->impl_).mtx_;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  if ((this->owner_)._M_thread == pVar1) {
    if (this->ncount_ == 0) {
      __assert_fail("0 < ncount_",
                    "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/include/fair_mutex.hpp"
                    ,0x147,"void yamc::fair::recursive_timed_mutex::lock()");
    }
    this->ncount_ = this->ncount_ + 1;
  }
  else {
    detail::timed_mutex_impl::impl_lock(&this->impl_,&local_28);
    this->ncount_ = 1;
    (this->owner_)._M_thread = pVar1;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void lock()
  {
    const auto tid = std::this_thread::get_id();
    auto lk = impl_.internal_lock();
    if (owner_ == tid) {
      assert(0 < ncount_);
      ++ncount_;
    } else {
      impl_.impl_lock(lk);
      ncount_ = 1;
      owner_ = tid;
    }
  }